

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::PushAsyncRequest
          (CommissionerSafe *this,AsyncRequest *aAsyncRequest)

{
  std::mutex::lock(&this->mInvokeMutex);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             &this->mAsyncRequestQueue,aAsyncRequest);
  event_active(&this->mInvokeEvent,0,0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mInvokeMutex);
  return;
}

Assistant:

void CommissionerSafe::PushAsyncRequest(AsyncRequest &&aAsyncRequest)
{
    std::lock_guard<std::mutex> _(mInvokeMutex);

    mAsyncRequestQueue.emplace(std::move(aAsyncRequest));

    // Notify for new async request
    event_active(&mInvokeEvent, 0, 0);
}